

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<4>::MixedDistributions::MixedDistributions
          (MixedDistributions *this,LegendreDistributions *legendre,
          TabulatedDistributions *tabulated)

{
  double dVar1;
  pointer plVar2;
  pointer pLVar3;
  pointer pTVar4;
  
  *(undefined8 *)
   &(this->legendre_).
    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
    interpolation_.super_InterpolationBase.metadata.fields =
       *(undefined8 *)
        &(legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
         ).super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
         interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->legendre_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          interpolation_.super_InterpolationBase.metadata.fields + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(legendre->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->legendre_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(legendre->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl
  ;
  dVar1 = ((_Head_base<1UL,_double,_false> *)
          ((long)&(legendre->
                  super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
                  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                  .interpolation_.super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x20))->
          _M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->legendre_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(legendre->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl
  ;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->legendre_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x20))->_M_head_impl = dVar1;
  ((_Head_base<0UL,_double,_false> *)
  ((long)&(this->legendre_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x28))->_M_head_impl =
       ((_Head_base<0UL,_double,_false> *)
       ((long)&(legendre->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x28))->_M_head_impl
  ;
  plVar2 = *(pointer *)
            ((long)&(legendre->
                    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                    ).
                    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                    .interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
  (this->legendre_).super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
  .super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
  interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
       interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_> + 8) = plVar2;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_> + 0x10) =
       *(pointer *)
        ((long)&(legendre->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(legendre->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) = (pointer)0x0;
  (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
  interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(legendre->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) = (pointer)0x0;
  plVar2 = *(pointer *)
            ((long)&(legendre->
                    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                    ).
                    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                    .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
  (this->legendre_).super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
  .super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
  interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
       interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_> + 8) = plVar2;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_> + 0x10) =
       *(pointer *)
        ((long)&(legendre->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(legendre->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) = (pointer)0x0;
  (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
  interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(legendre->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) = (pointer)0x0;
  pLVar3 = (legendre->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->legendre_).super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
  .super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.sequence_
  .
  super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
       sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
           ._M_impl.super__Vector_impl_data + 8) = pLVar3;
  *(pointer *)
   ((long)&(this->legendre_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.
       sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (legendre->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   &(this->tabulated_).
    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
    interpolation_.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> =
       *(undefined8 *)
        &(tabulated->
         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
         interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->tabulated_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          interpolation_.super_InterpolationBase.metadata.fields + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(tabulated->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->tabulated_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(tabulated->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl
  ;
  dVar1 = ((_Head_base<1UL,_double,_false> *)
          ((long)&(tabulated->
                  super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>)
                  .
                  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                  .interpolation_.super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x20))->
          _M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->tabulated_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(tabulated->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl
  ;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->tabulated_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x20))->_M_head_impl = dVar1;
  ((_Head_base<0UL,_double,_false> *)
  ((long)&(this->tabulated_).
          super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
          interpolation_.super_InterpolationBase.metadata.fields + 0x28))->_M_head_impl =
       ((_Head_base<0UL,_double,_false> *)
       ((long)&(tabulated->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
               .interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x28))->_M_head_impl
  ;
  plVar2 = *(pointer *)
            ((long)&(tabulated->
                    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                    ).
                    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                    .interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
  (this->tabulated_).
  super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
       ).super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
       interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_> + 8) = plVar2;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_> + 0x10) =
       *(pointer *)
        ((long)&(tabulated->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(tabulated->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) = (pointer)0x0;
  (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(tabulated->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) = (pointer)0x0;
  plVar2 = *(pointer *)
            ((long)&(tabulated->
                    super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                    ).
                    super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                    .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
  (this->tabulated_).
  super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
       ).super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
       interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_> + 8) = plVar2;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_> + 0x10) =
       *(pointer *)
        ((long)&(tabulated->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(tabulated->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) = (pointer)0x0;
  (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(tabulated->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) = (pointer)0x0;
  pTVar4 = (tabulated->
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->tabulated_).
  super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.sequence_
  .
  super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
       ).super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
       sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
           ._M_impl.super__Vector_impl_data + 8) = pTVar4;
  *(pointer *)
   ((long)&(this->tabulated_).
           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
           sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
       ).super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.
       sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.sequence_
  .
  super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.sequence_
  .
  super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tabulated->super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
  super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>.sequence_
  .
  super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  verifyBoundary((*(pointer *)
                   ((long)&(this->legendre_).
                           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                           .
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                           .sequence_.
                           super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
                           ._M_impl.super__Vector_impl_data + 8))[-1].super_ListRecord.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                 super__Head_base<1UL,_double,_false>._M_head_impl,
                 ((_Head_base<1UL,_double,_false> *)
                 ((long)&(((this->tabulated_).
                           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                           .
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                           .sequence_.
                           super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord).
                         super_InterpolationBase.metadata + 0x20))->_M_head_impl);
  return;
}

Assistant:

MixedDistributions( LegendreDistributions&& legendre,
                    TabulatedDistributions&& tabulated ) :
  legendre_( std::move( legendre ) ), tabulated_( std::move( tabulated ) ) {

    verifyBoundary(
      this->legendre_.angularDistributions().back().incidentEnergy(),
      this->tabulated_.angularDistributions().front().incidentEnergy() );
  }